

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O1

Vec_Ptr_t * Gia_ManMultiProveAig(Aig_Man_t *p,Bmc_MulPar_t *pPars)

{
  bool bVar1;
  int iVar2;
  int nTotalSize;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vOutMap;
  int *piVar5;
  Vec_Ptr_t *vCexesOut;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  Aig_Man_t *pAVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  void **extraout_RDX;
  long lVar14;
  void **extraout_RDX_00;
  void **extraout_RDX_01;
  void **extraout_RDX_02;
  Aig_Man_t *pAVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  timespec ts_2;
  Saig_ParBmc_t ParsBmc;
  Ssw_RarPars_t ParsSim;
  uint local_15c;
  abctime local_150;
  timespec local_138;
  Saig_ParBmc_t local_128;
  Ssw_RarPars_t local_90;
  
  iVar2 = clock_gettime(3,(timespec *)&local_128);
  if (iVar2 < 0) {
    local_150 = -1;
  }
  else {
    local_150 = (long)local_128._8_8_ / 1000 + local_128._0_8_ * 1000000;
  }
  if (pPars->TimeOutGlo == 0) {
    lVar12 = 0;
  }
  else {
    iVar2 = clock_gettime(3,(timespec *)&local_128);
    if (iVar2 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = (long)local_128._8_8_ / 1000 + local_128._0_8_ * 1000000;
    }
    lVar12 = (long)pPars->TimeOutGlo * 1000000 + lVar12;
  }
  iVar2 = p->nTruePos;
  local_15c = pPars->TimeOutLoc;
  nTotalSize = p->vObjs->nSize - p->nDeleted;
  if (pPars->fVerbose != 0) {
    printf("MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n"
           ,(ulong)(uint)pPars->TimeOutGlo,(ulong)local_15c,(ulong)(uint)pPars->TimeOutInc);
  }
  if (pPars->fVerbose != 0) {
    printf("Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n"
           ,(ulong)(uint)pPars->TimeOutGap,(ulong)(uint)pPars->TimePerOut,
           (ulong)(uint)pPars->fUseSyn,(ulong)(uint)pPars->fDumpFinal);
  }
  uVar4 = p->nTruePos;
  vOutMap = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar9 = uVar4;
  }
  vOutMap->nSize = 0;
  vOutMap->nCap = uVar9;
  if (uVar9 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)(int)uVar9 << 2);
  }
  vOutMap->pArray = piVar5;
  vOutMap->nSize = uVar4;
  if (0 < (int)uVar4) {
    uVar11 = 0;
    do {
      piVar5[uVar11] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  vCexesOut = (Vec_Ptr_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar4 - 1) {
    uVar9 = uVar4;
  }
  vCexesOut->nSize = 0;
  vCexesOut->nCap = uVar9;
  if (uVar9 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar9 << 3);
  }
  vCexesOut->pArray = ppvVar6;
  vCexesOut->nSize = uVar4;
  memset(ppvVar6,0,(long)(int)uVar4 << 3);
  iVar17 = 0;
  do {
    if ((long)vCexesOut->nSize < 1) {
      iVar18 = 0;
    }
    else {
      lVar13 = 0;
      iVar18 = 0;
      do {
        iVar18 = iVar18 + (uint)(vCexesOut->pArray[lVar13] == (void *)0x0);
        lVar13 = lVar13 + 1;
      } while (vCexesOut->nSize != lVar13);
    }
    Ssw_RarSetDefaultParams(&local_90);
    local_90.fSolveAll = 1;
    local_90.fNotVerbose = 1;
    local_90.fSilent = (int)(pPars->fVeryVerbose == 0);
    local_90.TimeOut = local_15c;
    local_90.nRandSeed = (uint)(iVar17 * 0x11) % 500;
    local_90.nWords = 5;
    Ssw_RarSimulate(p,&local_90);
    pAVar8 = p;
    if (p->vSeqModelVec == (Vec_Ptr_t *)0x0) {
LAB_005b4303:
      if (pPars->fVerbose != 0) {
        Gia_ManMultiReport(pAVar8,"SIM",iVar2,nTotalSize,local_150);
      }
      p = pAVar8;
      if (lVar12 != 0) {
        iVar3 = clock_gettime(3,&local_138);
        if (iVar3 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000;
        }
        if ((long)(int)local_15c * 1000000 + lVar13 <= lVar12) goto LAB_005b438a;
LAB_005b450c:
        uVar4 = pPars->TimeOutGlo;
        pcVar16 = "Global timeout (%d sec) is reached.\n";
LAB_005b4515:
        printf(pcVar16,(ulong)uVar4);
        goto LAB_005b451c;
      }
LAB_005b438a:
      Saig_ParBmcSetDefaultParams(&local_128);
      local_128.fSolveAll = 1;
      local_128.fNotVerbose = 1;
      local_128.fSilent = (int)(pPars->fVeryVerbose == 0);
      local_128.nTimeOut = local_15c;
      local_128.nTimeOutOne = pPars->TimePerOut;
      pAVar15 = pAVar8;
      Saig_ManBmcScalable(pAVar8,&local_128);
      ppvVar6 = extraout_RDX;
      if (pPars->fVeryVerbose != 0) {
        lVar13 = (long)pAVar8->vSeqModelVec->nSize;
        if (lVar13 < 1) {
          iVar3 = 0;
        }
        else {
          lVar14 = 0;
          iVar3 = 0;
          do {
            iVar3 = iVar3 + (uint)(pAVar8->vSeqModelVec->pArray[lVar14] == (void *)0x0);
            lVar14 = lVar14 + 1;
          } while (lVar13 != lVar14);
        }
        Abc_Print((int)pAVar15,"Some outputs are SAT (%d out of %d) after %d frames.\n",
                  (ulong)(uint)(pAVar8->nTruePos - iVar3),(ulong)(uint)pAVar8->nTruePos,
                  (ulong)(uint)local_128.iFrame);
        ppvVar6 = extraout_RDX_00;
      }
      if (pAVar8->vSeqModelVec != (Vec_Ptr_t *)0x0) {
        pVVar7 = Gia_ManProcessOutputs(pAVar8->vSeqModelVec,vCexesOut,vOutMap);
        if (pVVar7->nSize == 0) goto LAB_005b451c;
        p = Saig_ManDupCones(pAVar8,pVVar7->pArray,pVVar7->nSize);
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar7->pArray = (int *)0x0;
        }
        if (pVVar7 != (Vec_Int_t *)0x0) {
          free(pVVar7);
        }
        Aig_ManStop(pAVar8);
        ppvVar6 = extraout_RDX_01;
      }
      if (pPars->fVerbose != 0) {
        Gia_ManMultiReport(p,"BMC",iVar2,nTotalSize,local_150);
        ppvVar6 = extraout_RDX_02;
      }
      if (lVar12 != 0) {
        iVar3 = clock_gettime(3,&local_138);
        if (iVar3 < 0) {
          ppvVar6 = (void **)0xffffffffffffffff;
        }
        else {
          ppvVar6 = (void **)(local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000);
        }
        if (lVar12 < (long)(ppvVar6 + (long)(int)local_15c * 0x1e848)) goto LAB_005b450c;
      }
      iVar3 = (int)ppvVar6;
      uVar4 = pPars->TimeOutGap;
      if ((uVar4 != 0) && ((int)uVar4 <= (int)local_15c)) {
        if ((long)vCexesOut->nSize < 1) {
          iVar10 = 0;
        }
        else {
          ppvVar6 = vCexesOut->pArray;
          lVar13 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + (uint)(ppvVar6[lVar13] == (void *)0x0);
            lVar13 = lVar13 + 1;
          } while (vCexesOut->nSize != lVar13);
        }
        iVar3 = (int)ppvVar6;
        if (iVar18 == iVar10) {
          pcVar16 = "Gap timeout (%d sec) is reached.\n";
          goto LAB_005b4515;
        }
      }
      if (pPars->fUseSyn != 0) {
        pAVar8 = Gia_ManMultiProveSyn(p,uVar4,iVar3);
        Aig_ManStop(p);
        p = pAVar8;
        if (pPars->fVerbose != 0) {
          Gia_ManMultiReport(pAVar8,"SYN",iVar2,nTotalSize,local_150);
        }
      }
      local_15c = (int)(pPars->TimeOutInc * local_15c) / 100 + local_15c;
      bVar1 = false;
    }
    else {
      pVVar7 = Gia_ManProcessOutputs(p->vSeqModelVec,vCexesOut,vOutMap);
      if (pVVar7->nSize != 0) {
        pAVar8 = Saig_ManDupCones(p,pVVar7->pArray,pVVar7->nSize);
        if (pVVar7->pArray != (int *)0x0) {
          free(pVVar7->pArray);
          pVVar7->pArray = (int *)0x0;
        }
        if (pVVar7 != (Vec_Int_t *)0x0) {
          free(pVVar7);
        }
        Aig_ManStop(p);
        goto LAB_005b4303;
      }
LAB_005b451c:
      bVar1 = true;
    }
    if ((bVar1) || (iVar17 = iVar17 + 1, iVar17 == 1000)) {
      if (vOutMap->pArray != (int *)0x0) {
        free(vOutMap->pArray);
        vOutMap->pArray = (int *)0x0;
      }
      free(vOutMap);
      if (pPars->fVerbose != 0) {
        uVar4 = Gia_ManCountConst0Pos(p);
        printf("The number of POs proved UNSAT by synthesis = %d.\n",(ulong)uVar4);
      }
      if (pPars->fDumpFinal != 0) {
        pcVar16 = Extra_FileNameGenericAppend(p->pName,"_out.aig");
        Ioa_WriteAiger(p,pcVar16,0,0);
        printf("Final AIG was dumped into file \"%s\".\n",pcVar16);
      }
      Aig_ManStop(p);
      return vCexesOut;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_ManMultiProveAig( Aig_Man_t * p, Bmc_MulPar_t * pPars )
{
    Ssw_RarPars_t ParsSim, * pParsSim = &ParsSim;
    Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
    Vec_Int_t * vOutMap, * vLeftOver;
    Vec_Ptr_t * vCexes;
    Aig_Man_t * pTemp;
    abctime clkStart = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOutGlo ? Abc_Clock() + pPars->TimeOutGlo * CLOCKS_PER_SEC : 0;
    int nTotalPo     = Saig_ManPoNum(p);
    int nTotalSize   = Aig_ManObjNum(p);
    int TimeOutLoc   = pPars->TimeOutLoc;
    int i, RetValue  = -1;
    if ( pPars->fVerbose )
        printf( "MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n", 
            pPars->TimeOutGlo, pPars->TimeOutLoc, pPars->TimeOutInc );
    if ( pPars->fVerbose )
        printf( "Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n", 
            pPars->TimeOutGap, pPars->TimePerOut, pPars->fUseSyn, pPars->fDumpFinal, pPars->fVerbose );
    // create output map
    vOutMap = Vec_IntStartNatural( Saig_ManPoNum(p) ); // maps current outputs into their original IDs
    vCexes  = Vec_PtrStart( Saig_ManPoNum(p) );        // maps solved outputs into their CEXes (or markers)
    for ( i = 0; i < 1000; i++ )
    {
        int nSolved = Vec_PtrCountZero(vCexes);
        // perform SIM3
        Ssw_RarSetDefaultParams( pParsSim );
        pParsSim->fSolveAll = 1;
        pParsSim->fNotVerbose = 1;
        pParsSim->fSilent = !pPars->fVeryVerbose;
        pParsSim->TimeOut = TimeOutLoc;
        pParsSim->nRandSeed = (i * 17) % 500;
        pParsSim->nWords = 5;
        RetValue *= Ssw_RarSimulate( p, pParsSim );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "SIM", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // perform BMC
        Saig_ParBmcSetDefaultParams( pParsBmc );
        pParsBmc->fSolveAll = 1;
        pParsBmc->fNotVerbose = 1;
        pParsBmc->fSilent = !pPars->fVeryVerbose;
        pParsBmc->nTimeOut = TimeOutLoc;
        pParsBmc->nTimeOutOne = pPars->TimePerOut;
        RetValue *= Saig_ManBmcScalable( p, pParsBmc );
        if ( pPars->fVeryVerbose )
            Abc_Print( 1, "Some outputs are SAT (%d out of %d) after %d frames.\n", 
                Saig_ManPoNum(p) - Vec_PtrCountZero(p->vSeqModelVec), Saig_ManPoNum(p), pParsBmc->iFrame );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "BMC", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // check gap timeout
        if ( pPars->TimeOutGap && pPars->TimeOutGap <= TimeOutLoc && nSolved == Vec_PtrCountZero(vCexes) )
        {
            printf( "Gap timeout (%d sec) is reached.\n", pPars->TimeOutGap );
            break;
        }

        // synthesize
        if ( pPars->fUseSyn )
        {
            p = Gia_ManMultiProveSyn( pTemp = p, pPars->fVerbose, pPars->fVeryVerbose );
            Aig_ManStop( pTemp );
            if ( pPars->fVerbose )
                Gia_ManMultiReport( p, "SYN", nTotalPo, nTotalSize, clkStart );
        }

        // increase timeout
        TimeOutLoc += TimeOutLoc * pPars->TimeOutInc / 100;
    }
    Vec_IntFree( vOutMap );
    if ( pPars->fVerbose )
        printf( "The number of POs proved UNSAT by synthesis = %d.\n", Gia_ManCountConst0Pos(p) );
    if ( pPars->fDumpFinal )
    {
        char * pFileName = Extra_FileNameGenericAppend( p->pName, "_out.aig" );
        Ioa_WriteAiger( p, pFileName, 0, 0 );
        printf( "Final AIG was dumped into file \"%s\".\n", pFileName );
    }
    Aig_ManStop( p );
    return vCexes;
}